

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

void discover_cursed_equip(obj *otmp)

{
  char *pcVar1;
  bool bVar2;
  obj *otmp_local;
  
  if (((otmp != (obj *)0x0) && ((*(uint *)&otmp->field_0x4a & 1) != 0)) &&
     (*(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffffbf | 0x40,
     flags.verbose != '\0')) {
    bVar2 = true;
    if ((((otmp->quan < 2) && (bVar2 = true, otmp->oartifact != '\x1d')) &&
        ((bVar2 = true, otmp->otyp != 0xed &&
         ((otmp->oclass != '\x03' || (bVar2 = true, objects[otmp->otyp].oc_subtyp != '\x04')))))) &&
       (bVar2 = false, otmp->oclass == '\x03')) {
      bVar2 = objects[otmp->otyp].oc_subtyp == '\x03';
    }
    pcVar1 = "that feels";
    if (bVar2) {
      pcVar1 = "they feel";
    }
    pline("Oops; %s deathly cold.",pcVar1);
  }
  return;
}

Assistant:

static void discover_cursed_equip(struct obj *otmp)
{
	if (otmp && otmp->cursed) {
	    otmp->bknown = TRUE;
	    if (flags.verbose) {
		pline("Oops; %s deathly cold.",
		      (is_plural(otmp) || otmp->otyp == LENSES ||
		       is_boots(otmp) || is_gloves(otmp)) ?
		      "they feel" : "that feels");
	    }
	}
}